

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O2

bool QStyleHelper::hasAncestor(QObject *obj,Role role)

{
  bool bVar1;
  
  bVar1 = false;
  if (obj != (QObject *)0x0) goto LAB_0033ad1d;
  obj = (QObject *)0x0;
  while ((obj != (QObject *)0x0 && (bVar1 == false))) {
    bVar1 = isInstanceOf(obj,role);
LAB_0033ad1d:
    obj = *(QObject **)(*(long *)(obj + 8) + 0x10);
  }
  return bVar1;
}

Assistant:

bool hasAncestor(QObject *obj, QAccessible::Role role)
{
    bool found = false;
    QObject *parent = obj ? obj->parent() : nullptr;
    while (parent && !found) {
        if (isInstanceOf(parent, role))
            found = true;
        parent = parent->parent();
    }
    return found;
}